

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ClampWindowRect(ImGuiWindow *window,ImRect *rect,ImVec2 *padding)

{
  float _x;
  float _y;
  ImVec2 IVar1;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40 [2];
  ImVec2 local_30;
  ImVec2 size_for_clamping;
  ImGuiContext *g;
  ImVec2 *padding_local;
  ImRect *rect_local;
  ImGuiWindow *window_local;
  
  size_for_clamping = (ImVec2)GImGui;
  if ((((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) == 0) || ((window->Flags & 1U) != 0)) {
    local_30 = window->Size;
  }
  else {
    _x = (window->Size).x;
    _y = ImGuiWindow::TitleBarHeight(window);
    ImVec2::ImVec2(&local_30,_x,_y);
  }
  local_40[0] = operator-(&rect->Max,padding);
  local_58 = operator+(&window->Pos,&local_30);
  local_60 = operator+(&rect->Min,padding);
  local_50 = ImMax(&local_58,&local_60);
  local_48 = operator-(&local_50,&local_30);
  IVar1 = ImMin(local_40,&local_48);
  window->Pos = IVar1;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& rect, const ImVec2& padding)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar)) ? ImVec2(window->Size.x, window->TitleBarHeight()) : window->Size;
    window->Pos = ImMin(rect.Max - padding, ImMax(window->Pos + size_for_clamping, rect.Min + padding) - size_for_clamping);
}